

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

If * __thiscall
wasm::Builder::makeIf(Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse)

{
  If *this_00;
  
  this_00 = (If *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_00->condition = condition;
  this_00->ifTrue = ifTrue;
  this_00->ifFalse = ifFalse;
  If::finalize(this_00);
  return this_00;
}

Assistant:

If* makeIf(Expression* condition,
             Expression* ifTrue,
             Expression* ifFalse = nullptr) {
    auto* ret = wasm.allocator.alloc<If>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize();
    return ret;
  }